

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::internal::String::ShowCStringQuoted(char *c_str)

{
  size_t extraout_RDX;
  long in_RSI;
  char *in_RDI;
  String SVar2;
  size_t sVar1;
  
  if (in_RSI == 0) {
    String((String *)0x0,in_RDI);
    sVar1 = extraout_RDX;
  }
  else {
    SVar2 = Format(in_RDI,"\"%s\"",in_RSI);
    sVar1 = SVar2.length_;
  }
  SVar2.length_ = sVar1;
  SVar2.c_str_ = in_RDI;
  return SVar2;
}

Assistant:

String String::ShowCStringQuoted(const char* c_str) {
  return c_str ? String::Format("\"%s\"", c_str) : String("(null)");
}